

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall
imrt::Station::Station
          (Station *this,Collimator *collimator,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _angle,int max_apertures,
          int max_intensity,int initial_intensity,int step_intensity,int open_apertures,int setup,
          fstream *myfile)

{
  bool bVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *__x;
  size_type sVar3;
  ulong uVar4;
  Matrix *pMVar5;
  mapped_type *ppMVar6;
  double *pdVar7;
  undefined4 in_ECX;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_RDX;
  Collimator *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar8;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  void *in_stack_00000028;
  int in_stack_00000038;
  int in_stack_0000003c;
  Station *in_stack_00000040;
  int a;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  Volume *in_stack_fffffffffffffe80;
  Collimator *in_stack_fffffffffffffe88;
  Matrix *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int iVar9;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  key_type_conflict *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  undefined8 *intensity;
  undefined8 *puVar10;
  Station *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_3c;
  undefined1 local_35 [29];
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_18;
  Collimator *local_10;
  
  *in_RDI = &PTR__Station_001a2be0;
  *(undefined4 *)(in_RDI + 1) = in_ECX;
  local_35._17_4_ = in_R9D;
  local_35._21_4_ = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
  ::map((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
         *)0x149e3f);
  *(undefined4 *)(in_RDI + 8) = local_35._21_4_;
  *(undefined4 *)((long)in_RDI + 0x44) = local_35._17_4_;
  *(undefined4 *)((long)in_RDI + 0x4c) = in_stack_00000008;
  *(undefined4 *)(in_RDI + 10) = in_stack_00000010;
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  allocator((allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *)
            0x149ea0);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
           in_stack_fffffffffffffe98,(allocator_type *)in_stack_fffffffffffffe90);
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~allocator((allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *)
             0x149ecc);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::
  pair<std::pair<int,_int>,_std::pair<int,_int>,_true>
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)in_stack_fffffffffffffe80);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x149ef8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x149f14);
  in_RDI[0x16] = local_10;
  maths::Matrix::Matrix((Matrix *)in_stack_fffffffffffffe80);
  this_00 = (Station *)(in_RDI + 0x19);
  __x = (vector<double,_std::allocator<double>_> *)(long)(int)local_35._21_4_;
  this_01 = (vector<double,_std::allocator<double>_> *)local_35;
  std::allocator<double>::allocator((allocator<double> *)0x149f7c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,(allocator_type *)in_stack_fffffffffffffe90);
  std::allocator<double>::~allocator((allocator<double> *)0x149fa8);
  diff = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)(in_RDI + 0x1c);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x149fc4);
  intensity = in_RDI + 0x22;
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x149fe0);
  puVar10 = in_RDI + 0x28;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x149ffc)
  ;
  *(undefined4 *)(in_RDI + 9) = 1;
  sVar3 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size(local_18);
  *(int *)((long)in_RDI + 0x54) = (int)sVar3;
  for (local_3c = 0; uVar4 = (ulong)local_3c,
      sVar3 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size(local_18),
      uVar4 < sVar3; local_3c = local_3c + 1) {
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[](local_18,(long)local_3c);
    pMVar5 = Volume::getDepositionMatrix(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    ppMVar6 = std::
              map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
              ::operator[]((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffeb8);
    *ppMVar6 = pMVar5;
  }
  Collimator::getXdim(local_10);
  Collimator::getYdim(local_10);
  maths::Matrix::Matrix
            (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (int)in_stack_fffffffffffffe88);
  maths::Matrix::operator=
            ((Matrix *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (Matrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  maths::Matrix::~Matrix(in_stack_fffffffffffffe90);
  for (local_54 = 0; iVar9 = local_54, iVar2 = Collimator::getXdim(local_10), iVar9 < iVar2;
      local_54 = local_54 + 1) {
    for (local_58 = 0; iVar9 = local_58, iVar2 = Collimator::getYdim(local_10), iVar9 < iVar2;
        local_58 = local_58 + 1) {
      bVar1 = Collimator::isActiveBeamAngle
                        (in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                         (int)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      if (bVar1) {
        pdVar7 = maths::Matrix::operator()((Matrix *)(in_RDI + 0x17),local_54,local_58);
        *pdVar7 = 0.0;
      }
      else {
        pdVar7 = maths::Matrix::operator()((Matrix *)(in_RDI + 0x17),local_54,local_58);
        *pdVar7 = -1.0;
      }
    }
  }
  initializeStation(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  if (in_stack_00000028 != (void *)0x0) {
    local_5c = 0;
    while (iVar9 = local_5c, iVar2 = Collimator::getXdim(local_10), iVar9 < iVar2) {
      local_60 = 0;
      while (iVar9 = local_60, iVar2 = Collimator::getYdim(local_10), iVar9 < iVar2) {
        std::istream::operator>>(in_stack_00000028,&local_64);
        if (local_64 != -1) {
          change_intensity(this_00,(int)((ulong)puVar10 >> 0x20),(int)puVar10,(double)intensity,diff
                          );
        }
        local_60 = local_60 + 1;
      }
      local_5c = local_5c + 1;
    }
  }
  std::make_pair<int,int>
            ((int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),(int *)0x14a49e);
  std::make_pair<int,int>
            ((int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),(int *)0x14a4dd);
  pVar8 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                    ((pair<int,_int> *)in_stack_fffffffffffffe80,
                     (pair<int,_int> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                    );
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)pVar8.second,
             (type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<double,_std::allocator<double>_>::operator=(this_01,__x);
  return;
}

Assistant:

Station::Station(Collimator& collimator, vector<Volume>& volumes, int _angle, int max_apertures,
                   int max_intensity, int initial_intensity, int step_intensity, int open_apertures, int setup, fstream* myfile):
		collimator(collimator), angle(_angle) , max_apertures(max_apertures), A(max_apertures),
		intensity(max_apertures), max_intensity(max_intensity), initial_intensity(initial_intensity),
                step_intensity(step_intensity) {
    
    min_intensity=1;
    if(open_apertures==-1) open_apertures=max_apertures;

    n_volumes=volumes.size();
    for (int i=0; i<volumes.size(); i++)
      D[i]=&volumes[i].getDepositionMatrix(angle);

    // Initialize empty matrix of intensity
    I = Matrix (collimator.getXdim(), collimator.getYdim());
    for (int i=0; i<collimator.getXdim(); i++) {
      for (int j=0; j<collimator.getYdim(); j++) {
        if (collimator.isActiveBeamAngle(i,j,angle)) {
          I(i,j)=0;
        } else {
          I(i,j)=-1;
        }
      }
    }

    // Iniatialize apertures (alternative representation)
    initializeStation(setup, open_apertures);

    if(myfile) {
    	for (int i=0; i<collimator.getXdim(); i++) {
    	   for (int j=0; j<collimator.getYdim(); j++) {
    		   int a; *myfile>>a;
    		   if(a!=-1) change_intensity(i, j, a);
    	   }
    	}
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_intensity = intensity; 
  }